

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int hd_context_init(nghttp2_hd_context *context,nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_hd_entry **ppnVar2;
  
  context->mem = mem;
  context->bad = '\0';
  context->hd_table_bufsize_max = 0x1000;
  ppnVar2 = (nghttp2_hd_entry **)nghttp2_mem_malloc(mem,0x400);
  (context->hd_table).buffer = ppnVar2;
  if (ppnVar2 == (nghttp2_hd_entry **)0x0) {
    iVar1 = -0x385;
  }
  else {
    (context->hd_table).mask = 0x7f;
    (context->hd_table).first = 0;
    (context->hd_table).len = 0;
    context->hd_table_bufsize = 0;
    context->next_seq = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int hd_context_init(nghttp2_hd_context *context, nghttp2_mem *mem) {
  int rv;
  context->mem = mem;
  context->bad = 0;
  context->hd_table_bufsize_max = NGHTTP2_HD_DEFAULT_MAX_BUFFER_SIZE;
  rv = hd_ringbuf_init(
      &context->hd_table,
      context->hd_table_bufsize_max / NGHTTP2_HD_ENTRY_OVERHEAD, mem);
  if (rv != 0) {
    return rv;
  }

  context->hd_table_bufsize = 0;
  context->next_seq = 0;

  return 0;
}